

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmaes.cpp
# Opt level: O2

void __thiscall Cmaes::Cmaes(Cmaes *this)

{
  string local_40;
  allocator local_19;
  
  std::__cxx11::string::string((string *)&local_40,"CMAES",&local_19);
  Optimizer::Optimizer(&this->super_Optimizer,&local_40,CMAES);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Optimizer)._vptr_Optimizer = (_func_int **)&PTR_getName_abi_cxx11__00188cf0;
  memset(&this->xmean,0,0x108);
  return;
}

Assistant:

Cmaes::Cmaes(void) : Optimizer("CMAES", CMAES) 
{
}